

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hq3x_16.cpp
# Opt level: O0

void Interp4(uchar *pc,int c1,int c2,int c3)

{
  hq_vec *right;
  int iVar1;
  hq_vec local_38;
  hq_vec local_30;
  hq_vec local_28;
  hq_vec result;
  int c3_local;
  int c2_local;
  int c1_local;
  uchar *pc_local;
  
  iVar1 = c1;
  result.m_value[0]._4_4_ = c3;
  hq_vec::load((hq_vec *)(ulong)(uint)c2,c1);
  hq_vec::load((hq_vec *)(ulong)result.m_value[0]._4_4_,iVar1);
  hq_vec::operator+=(&local_28,&local_30);
  iVar1 = 0xc40f48;
  hq_vec::operator*=(&local_28,&const7);
  hq_vec::load((hq_vec *)(ulong)(uint)c1,iVar1);
  right = hq_vec::operator<<(&local_38,1);
  hq_vec::operator+=(&local_28,right);
  hq_vec::operator>>(&local_28,4);
  hq_vec::store(&local_28,pc);
  return;
}

Assistant:

inline void Interp4(unsigned char * pc, int c1, int c2, int c3)
{
  // *((int*)pc) = (c1*2+(c2+c3)*7)/16;

  hq_vec result = hq_vec::load(c2);

  result += hq_vec::load(c3);
  result *= const7;
  result += hq_vec::load(c1) << 1;
  result >> 4;

  result.store(pc);
}